

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O3

void __thiscall
cuckoocache_tests::EraseTest::test_cache_erase<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseTest *this,size_t megabytes)

{
  uchar *puVar1;
  pointer puVar2;
  pointer puVar3;
  atomic<unsigned_char> *paVar4;
  uchar *puVar5;
  uint uVar6;
  uint256 e;
  uint256 e_00;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  uint uVar9;
  uint64_t uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  iterator in_R8;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  readonly_property65 rVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  double hit_rate_fresh;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  check_type cVar38;
  char *pcVar37;
  double local_278;
  double local_248;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined8 local_200;
  undefined1 local_1f8 [16];
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  double local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  vector<uint256,_std::allocator<uint256>_> local_180;
  undefined1 local_168 [16];
  pointer local_158;
  undefined8 *local_150;
  assertion_result local_148;
  undefined8 **local_130;
  double *local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  undefined1 local_f8 [40];
  _Bit_iterator_base local_d0;
  _Bit_iterator_base local_c0;
  undefined1 local_b0 [16];
  uint8_t local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  check_type cStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  lazy_ostream local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_168 = (undefined1  [16])0x0;
  local_158 = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_f8._24_4_ = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._32_8_ = operator_new__(0);
  local_d0._M_p = (_Bit_type *)0x0;
  local_d0._M_offset = 0;
  local_d0._12_4_ = 0;
  local_c0._M_p = (_Bit_type *)0x0;
  local_c0._M_offset = 0;
  local_c0._12_4_ = 0;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = '\0';
  uVar18 = megabytes << 0xf;
  uVar13 = uVar18 & 0x7ffffffffff8000;
  if (0xfffffffe < uVar13) {
    uVar13 = 0xffffffff;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
            ((cache<uint256,_SignatureCacheHasher> *)local_f8,(uint32_t)uVar13);
  iVar17 = (int)uVar18;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)local_168,uVar18 & 0xffffffff);
  if (iVar17 != 0) {
    lVar19 = 0;
    uVar13 = 0;
    do {
      uVar8 = local_168._0_8_;
      lVar11 = 0;
      do {
        uVar10 = RandomMixin<FastRandomContext>::randbits<32>
                           (&(this->super_BasicTestingSetup).m_rng.
                             super_RandomMixin<FastRandomContext>);
        *(int *)((((base_blob<256U> *)uVar8)->m_data)._M_elems + lVar11 * 4 + lVar19) = (int)uVar10;
        lVar11 = lVar11 + 1;
      } while ((char)lVar11 != '\b');
      uVar13 = uVar13 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar13 != (uVar18 & 0xffffffff));
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&local_180,(vector<uint256,_std::allocator<uint256>_> *)local_168);
  uVar20 = (uint)(uVar18 >> 1) & 0x7fffffff;
  local_248 = 0.0;
  uVar6 = (uint)megabytes;
  if (iVar17 != 0) {
    lVar19 = 0;
    do {
      puVar1 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar19;
      local_78 = *(undefined8 *)puVar1;
      _cVar38 = *(check_type *)(puVar1 + 8);
      puVar5 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar19 + 0x10;
      local_68 = *(undefined8 *)puVar5;
      uStack_60 = *(undefined8 *)(puVar5 + 8);
      e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_68;
      e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_68 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_68 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_68 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_68 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_68 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_68 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_68 >> 0x38);
      e.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
      e.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_60;
      e.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_60 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_60 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_60 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_60 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_60 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_60 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_60 >> 0x38);
      _cStack_70 = _cVar38;
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                ((cache<uint256,_SignatureCacheHasher> *)local_f8,e);
      lVar19 = lVar19 + 0x20;
    } while ((ulong)(uVar20 + ((uVar18 >> 1 & 0x7fffffff) == 0)) << 5 != lVar19);
    if (iVar17 != 0) {
      uVar13 = uVar18 >> 2;
      uVar9 = (uint)uVar13 & 0x3fffffff;
      uVar21 = 0;
      do {
        local_190 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
        ;
        local_188 = "";
        local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_198 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0x9b;
        file.m_begin = (iterator)&local_190;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a0,
                   msg);
        puVar2 = (pointer)(local_168._0_8_ + uVar21 * 0x20);
        uVar14 = (ulong)(uint)local_f8._24_4_;
        local_58._vptr_lazy_ostream =
             (_func_int **)
             CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                      super_base_blob<256U>).m_data._M_elems + 4) * uVar14 >> 0x20),
                      (int)(*(uint *)(((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                     super_base_blob<256U>).m_data._M_elems * uVar14 >> 0x20));
        local_58._8_4_ =
             SUB84(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->super_base_blob<256U>).
                             m_data._M_elems + 8) * uVar14 >> 0x20,0);
        local_58._12_4_ =
             (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->super_base_blob<256U>).
                             m_data._M_elems + 0xc) * uVar14 >> 0x20);
        local_48 = (undefined1 *)
                   CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x14) * uVar14
                                 >> 0x20),
                            (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x10) * uVar14
                                 >> 0x20));
        local_40 = (lazy_ostream *)
                   CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar14
                                 >> 0x20),
                            (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x18) * uVar14
                                 >> 0x20));
        auVar30 = *(undefined1 (*) [16])((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
        lVar19 = 0;
        do {
          uVar12 = *(uint *)((long)&local_58._vptr_lazy_ostream + lVar19);
          puVar3 = (pointer)(local_f8._0_8_ + (ulong)uVar12 * 0x20);
          auVar29[0] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar29[1] = -((puVar3->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar29[2] = -((puVar3->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar29[3] = -((puVar3->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar29[4] = -((puVar3->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar29[5] = -((puVar3->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar29[6] = -((puVar3->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar29[7] = -((puVar3->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar29[8] = -((puVar3->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar29[9] = -((puVar3->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar29[10] = -((puVar3->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar29[0xb] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar29[0xc] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar29[0xd] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar29[0xe] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar29[0xf] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          puVar1 = (((pointer)(local_f8._0_8_ + (ulong)uVar12 * 0x20))->super_base_blob<256U>).
                   m_data._M_elems + 0x10;
          auVar33[0] = -(*puVar1 == auVar30[0]);
          auVar33[1] = -(puVar1[1] == auVar30[1]);
          auVar33[2] = -(puVar1[2] == auVar30[2]);
          auVar33[3] = -(puVar1[3] == auVar30[3]);
          auVar33[4] = -(puVar1[4] == auVar30[4]);
          auVar33[5] = -(puVar1[5] == auVar30[5]);
          auVar33[6] = -(puVar1[6] == auVar30[6]);
          auVar33[7] = -(puVar1[7] == auVar30[7]);
          auVar33[8] = -(puVar1[8] == auVar30[8]);
          auVar33[9] = -(puVar1[9] == auVar30[9]);
          auVar33[10] = -(puVar1[10] == auVar30[10]);
          auVar33[0xb] = -(puVar1[0xb] == auVar30[0xb]);
          auVar33[0xc] = -(puVar1[0xc] == auVar30[0xc]);
          auVar33[0xd] = -(puVar1[0xd] == auVar30[0xd]);
          auVar33[0xe] = -(puVar1[0xe] == auVar30[0xe]);
          auVar33[0xf] = -(puVar1[0xf] == auVar30[0xf]);
          auVar33 = auVar33 & auVar29;
          rVar22.super_readonly_property<bool>.super_class_property<bool>.value =
               (readonly_property<bool>)
               ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff);
          if ((bool)rVar22.super_readonly_property<bool>.super_class_property<bool>.value) {
            LOCK();
            paVar4 = (atomic<unsigned_char> *)(local_f8._32_8_ + (ulong)(uVar12 >> 3));
            (paVar4->super___atomic_base<unsigned_char>)._M_i =
                 (paVar4->super___atomic_base<unsigned_char>)._M_i | (byte)(1 << ((byte)uVar12 & 7))
            ;
            UNLOCK();
            break;
          }
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0x20);
        local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             rVar22.super_readonly_property<bool>.super_class_property<bool>.value;
        local_148.m_message.px = (element_type *)0x0;
        local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1f8._0_8_ = "set.contains(hashes[i], true)";
        local_1f8._8_8_ = "";
        local_58._8_4_ = local_58._8_4_ & 0xffffff00;
        local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
        local_48 = boost::unit_test::lazy_ostream::inst;
        local_40 = (lazy_ostream *)local_1f8;
        local_1b0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
        ;
        local_1a8 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_148,&local_58,1,0,WARN,_cVar38,(size_t)&local_1b0,0x9b);
        boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar9 + ((uVar13 & 0x3fffffff) == 0));
      if (iVar17 != 0) {
        uVar21 = (ulong)((uVar6 & 0x1ffff) << 0xe);
        lVar19 = (ulong)(uVar6 & 0x1ffff) << 0x13;
        do {
          puVar1 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                   lVar19;
          local_98 = *(undefined8 *)puVar1;
          uStack_90 = *(undefined8 *)(puVar1 + 8);
          puVar5 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                   lVar19 + 0x10;
          local_88 = *(undefined8 *)puVar5;
          uStack_80 = *(undefined8 *)(puVar5 + 8);
          e_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_88;
          e_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_88 >> 8);
          e_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_88 >> 0x10);
          e_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_88 >> 0x18);
          e_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_88 >> 0x20);
          e_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_88 >> 0x28);
          e_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_88 >> 0x30);
          e_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_88 >> 0x38);
          e_00.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
          e_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_80;
          e_00.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_80 >> 8);
          e_00.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_80 >> 0x10);
          e_00.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_80 >> 0x18);
          e_00.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_80 >> 0x20);
          e_00.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_80 >> 0x28);
          e_00.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_80 >> 0x30);
          e_00.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_80 >> 0x38);
          CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                    ((cache<uint256,_SignatureCacheHasher> *)local_f8,e_00);
          uVar21 = uVar21 + 1;
          lVar19 = lVar19 + 0x20;
        } while (uVar21 < (uVar18 & 0xffffffff));
        if (iVar17 != 0) {
          uVar21 = (ulong)(uint)local_f8._24_4_;
          uVar14 = 0;
          in_R8 = (iterator)0x0;
          do {
            puVar2 = (pointer)(local_168._0_8_ + uVar14 * 0x20);
            local_58._vptr_lazy_ostream =
                 (_func_int **)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 4) * uVar21 >>
                               0x20),
                          (int)(*(uint *)(((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                         super_base_blob<256U>).m_data._M_elems * uVar21 >> 0x20));
            local_58._8_4_ =
                 (uint)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                  super_base_blob<256U>).m_data._M_elems + 8) * uVar21 >> 0x20);
            local_58._12_4_ =
                 (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                 super_base_blob<256U>).m_data._M_elems + 0xc) * uVar21 >> 0x20);
            local_48 = (undefined1 *)
                       CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                                super_base_blob<256U>).m_data._M_elems + 0x14) *
                                      uVar21 >> 0x20),
                                (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                                super_base_blob<256U>).m_data._M_elems + 0x10) *
                                      uVar21 >> 0x20));
            local_40 = (lazy_ostream *)
                       CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                                super_base_blob<256U>).m_data._M_elems + 0x1c) *
                                      uVar21 >> 0x20),
                                (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar14 * 0x20))->
                                                super_base_blob<256U>).m_data._M_elems + 0x18) *
                                      uVar21 >> 0x20));
            pvVar15 = (iterator)0x0;
            do {
              puVar3 = (pointer)(local_f8._0_8_ +
                                (ulong)*(uint *)(pvVar15 + (long)&local_58._vptr_lazy_ostream) *
                                0x20);
              auVar30[0] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
              auVar30[1] = -((puVar3->super_base_blob<256U>).m_data._M_elems[1] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
              auVar30[2] = -((puVar3->super_base_blob<256U>).m_data._M_elems[2] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
              auVar30[3] = -((puVar3->super_base_blob<256U>).m_data._M_elems[3] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
              auVar30[4] = -((puVar3->super_base_blob<256U>).m_data._M_elems[4] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
              auVar30[5] = -((puVar3->super_base_blob<256U>).m_data._M_elems[5] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
              auVar30[6] = -((puVar3->super_base_blob<256U>).m_data._M_elems[6] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
              auVar30[7] = -((puVar3->super_base_blob<256U>).m_data._M_elems[7] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
              auVar30[8] = -((puVar3->super_base_blob<256U>).m_data._M_elems[8] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
              auVar30[9] = -((puVar3->super_base_blob<256U>).m_data._M_elems[9] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
              auVar30[10] = -((puVar3->super_base_blob<256U>).m_data._M_elems[10] ==
                             (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
              auVar30[0xb] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xb] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
              auVar30[0xc] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xc] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
              auVar30[0xd] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xd] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
              auVar30[0xe] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xe] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
              auVar30[0xf] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xf] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
              puVar1 = (((pointer)
                        (local_f8._0_8_ +
                        (ulong)*(uint *)(pvVar15 + (long)&local_58._vptr_lazy_ostream) * 0x20))->
                       super_base_blob<256U>).m_data._M_elems + 0x10;
              auVar34[0] = -(*puVar1 == (puVar2->super_base_blob<256U>).m_data._M_elems[0x10]);
              auVar34[1] = -(puVar1[1] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x11]);
              auVar34[2] = -(puVar1[2] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x12]);
              auVar34[3] = -(puVar1[3] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x13]);
              auVar34[4] = -(puVar1[4] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x14]);
              auVar34[5] = -(puVar1[5] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x15]);
              auVar34[6] = -(puVar1[6] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x16]);
              auVar34[7] = -(puVar1[7] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x17]);
              auVar34[8] = -(puVar1[8] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x18]);
              auVar34[9] = -(puVar1[9] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x19]);
              auVar34[10] = -(puVar1[10] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1a]);
              auVar34[0xb] = -(puVar1[0xb] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1b])
              ;
              auVar34[0xc] = -(puVar1[0xc] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1c])
              ;
              auVar34[0xd] = -(puVar1[0xd] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1d])
              ;
              auVar34[0xe] = -(puVar1[0xe] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1e])
              ;
              auVar34[0xf] = -(puVar1[0xf] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1f])
              ;
              auVar34 = auVar34 & auVar30;
              bVar23 = (ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff;
              in_R9 = pvVar15;
              if (bVar23) break;
              in_R9 = pvVar15 + 4;
              bVar24 = pvVar15 != (iterator)0x1c;
              pvVar15 = in_R9;
            } while (bVar24);
            in_R8 = in_R8 + bVar23;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar9 + ((uVar13 & 0x3fffffff) == 0));
          auVar25._8_4_ = (int)((ulong)in_R8 >> 0x20);
          auVar25._0_8_ = in_R8;
          auVar25._12_4_ = 0x45300000;
          local_278 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0);
          goto LAB_00372820;
        }
      }
      local_278 = 0.0;
      goto LAB_00372820;
    }
  }
  uVar9 = 0;
  local_278 = 0.0;
LAB_00372820:
  if (uVar9 < uVar20) {
    uVar13 = (ulong)(uint)local_f8._24_4_;
    uVar12 = (uVar6 & 0x1ffff) * 0x2000;
    uVar21 = (ulong)uVar12;
    lVar19 = 0;
    do {
      puVar2 = (pointer)(local_168._0_8_ + uVar21 * 0x20);
      local_58._vptr_lazy_ostream =
           (_func_int **)
           CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                    super_base_blob<256U>).m_data._M_elems + 4) * uVar13 >> 0x20),
                    (int)(*(uint *)(((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                   super_base_blob<256U>).m_data._M_elems * uVar13 >> 0x20));
      local_58._8_4_ =
           (uint)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->super_base_blob<256U>).
                            m_data._M_elems + 8) * uVar13 >> 0x20);
      local_58._12_4_ =
           (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 0xc) * uVar13 >> 0x20);
      local_48 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar13 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar13 >>
                               0x20));
      local_40 = (lazy_ostream *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar13 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar13 >>
                               0x20));
      pvVar15 = (iterator)0x0;
      do {
        puVar3 = (pointer)(local_f8._0_8_ +
                          (ulong)*(uint *)(pvVar15 + (long)&local_58._vptr_lazy_ostream) * 0x20);
        auVar31[0] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
        auVar31[1] = -((puVar3->super_base_blob<256U>).m_data._M_elems[1] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
        auVar31[2] = -((puVar3->super_base_blob<256U>).m_data._M_elems[2] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
        auVar31[3] = -((puVar3->super_base_blob<256U>).m_data._M_elems[3] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
        auVar31[4] = -((puVar3->super_base_blob<256U>).m_data._M_elems[4] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
        auVar31[5] = -((puVar3->super_base_blob<256U>).m_data._M_elems[5] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
        auVar31[6] = -((puVar3->super_base_blob<256U>).m_data._M_elems[6] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
        auVar31[7] = -((puVar3->super_base_blob<256U>).m_data._M_elems[7] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
        auVar31[8] = -((puVar3->super_base_blob<256U>).m_data._M_elems[8] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
        auVar31[9] = -((puVar3->super_base_blob<256U>).m_data._M_elems[9] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
        auVar31[10] = -((puVar3->super_base_blob<256U>).m_data._M_elems[10] ==
                       (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
        auVar31[0xb] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xb] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
        auVar31[0xc] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xc] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
        auVar31[0xd] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xd] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
        auVar31[0xe] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xe] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
        auVar31[0xf] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xf] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
        puVar1 = (((pointer)
                  (local_f8._0_8_ +
                  (ulong)*(uint *)(pvVar15 + (long)&local_58._vptr_lazy_ostream) * 0x20))->
                 super_base_blob<256U>).m_data._M_elems + 0x10;
        auVar35[0] = -(*puVar1 == (puVar2->super_base_blob<256U>).m_data._M_elems[0x10]);
        auVar35[1] = -(puVar1[1] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x11]);
        auVar35[2] = -(puVar1[2] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x12]);
        auVar35[3] = -(puVar1[3] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x13]);
        auVar35[4] = -(puVar1[4] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x14]);
        auVar35[5] = -(puVar1[5] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x15]);
        auVar35[6] = -(puVar1[6] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x16]);
        auVar35[7] = -(puVar1[7] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x17]);
        auVar35[8] = -(puVar1[8] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x18]);
        auVar35[9] = -(puVar1[9] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x19]);
        auVar35[10] = -(puVar1[10] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1a]);
        auVar35[0xb] = -(puVar1[0xb] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1b]);
        auVar35[0xc] = -(puVar1[0xc] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1c]);
        auVar35[0xd] = -(puVar1[0xd] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1d]);
        auVar35[0xe] = -(puVar1[0xe] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1e]);
        auVar35[0xf] = -(puVar1[0xf] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1f]);
        auVar35 = auVar35 & auVar31;
        bVar24 = (ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff;
        bVar23 = !bVar24;
        in_R8 = pvVar15;
        if (bVar24) break;
        in_R8 = pvVar15 + 4;
        bVar24 = pvVar15 != (iterator)0x1c;
        pvVar15 = in_R8;
      } while (bVar24);
      in_R9 = (iterator)(ulong)bVar23;
      lVar19 = lVar19 + (ulong)!bVar23;
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uVar20 + uVar12) - uVar9);
    auVar26._8_4_ = (int)((ulong)lVar19 >> 0x20);
    auVar26._0_8_ = lVar19;
    auVar26._12_4_ = 0x45300000;
    local_248 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
  }
  if (iVar17 == 0) {
    dVar28 = 0.0;
  }
  else {
    uVar13 = (ulong)(uint)local_f8._24_4_;
    uVar21 = (ulong)((uVar6 & 0x1ffff) << 0xe);
    lVar19 = 0;
    do {
      puVar2 = (pointer)(local_168._0_8_ + uVar21 * 0x20);
      local_58._vptr_lazy_ostream =
           (_func_int **)
           CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                    super_base_blob<256U>).m_data._M_elems + 4) * uVar13 >> 0x20),
                    (int)(*(uint *)(((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                   super_base_blob<256U>).m_data._M_elems * uVar13 >> 0x20));
      local_58._8_4_ =
           (uint)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->super_base_blob<256U>).
                            m_data._M_elems + 8) * uVar13 >> 0x20);
      local_58._12_4_ =
           (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 0xc) * uVar13 >> 0x20);
      local_48 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar13 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar13 >>
                               0x20));
      local_40 = (lazy_ostream *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar13 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar21 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar13 >>
                               0x20));
      pvVar15 = (iterator)0x0;
      do {
        puVar3 = (pointer)(local_f8._0_8_ +
                          (ulong)*(uint *)(pvVar15 + (long)&local_58._vptr_lazy_ostream) * 0x20);
        auVar32[0] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
        auVar32[1] = -((puVar3->super_base_blob<256U>).m_data._M_elems[1] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
        auVar32[2] = -((puVar3->super_base_blob<256U>).m_data._M_elems[2] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
        auVar32[3] = -((puVar3->super_base_blob<256U>).m_data._M_elems[3] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
        auVar32[4] = -((puVar3->super_base_blob<256U>).m_data._M_elems[4] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
        auVar32[5] = -((puVar3->super_base_blob<256U>).m_data._M_elems[5] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
        auVar32[6] = -((puVar3->super_base_blob<256U>).m_data._M_elems[6] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
        auVar32[7] = -((puVar3->super_base_blob<256U>).m_data._M_elems[7] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
        auVar32[8] = -((puVar3->super_base_blob<256U>).m_data._M_elems[8] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
        auVar32[9] = -((puVar3->super_base_blob<256U>).m_data._M_elems[9] ==
                      (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
        auVar32[10] = -((puVar3->super_base_blob<256U>).m_data._M_elems[10] ==
                       (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
        auVar32[0xb] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xb] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
        auVar32[0xc] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xc] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
        auVar32[0xd] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xd] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
        auVar32[0xe] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xe] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
        auVar32[0xf] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xf] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
        puVar1 = (((pointer)
                  (local_f8._0_8_ +
                  (ulong)*(uint *)(pvVar15 + (long)&local_58._vptr_lazy_ostream) * 0x20))->
                 super_base_blob<256U>).m_data._M_elems + 0x10;
        auVar36[0] = -(*puVar1 == (puVar2->super_base_blob<256U>).m_data._M_elems[0x10]);
        auVar36[1] = -(puVar1[1] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x11]);
        auVar36[2] = -(puVar1[2] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x12]);
        auVar36[3] = -(puVar1[3] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x13]);
        auVar36[4] = -(puVar1[4] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x14]);
        auVar36[5] = -(puVar1[5] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x15]);
        auVar36[6] = -(puVar1[6] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x16]);
        auVar36[7] = -(puVar1[7] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x17]);
        auVar36[8] = -(puVar1[8] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x18]);
        auVar36[9] = -(puVar1[9] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x19]);
        auVar36[10] = -(puVar1[10] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1a]);
        auVar36[0xb] = -(puVar1[0xb] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1b]);
        auVar36[0xc] = -(puVar1[0xc] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1c]);
        auVar36[0xd] = -(puVar1[0xd] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1d]);
        auVar36[0xe] = -(puVar1[0xe] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1e]);
        auVar36[0xf] = -(puVar1[0xf] == (puVar2->super_base_blob<256U>).m_data._M_elems[0x1f]);
        auVar36 = auVar36 & auVar32;
        bVar24 = (ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) == 0xffff;
        bVar23 = !bVar24;
        in_R8 = pvVar15;
        if (bVar24) break;
        in_R8 = pvVar15 + 4;
        bVar24 = pvVar15 != (iterator)0x1c;
        pvVar15 = in_R8;
      } while (bVar24);
      in_R9 = (iterator)(ulong)bVar23;
      lVar19 = lVar19 + (ulong)!bVar23;
      uVar21 = uVar21 + 1;
    } while (uVar21 < (uVar18 & 0xffffffff));
    auVar27._8_4_ = (int)((ulong)lVar19 >> 0x20);
    auVar27._0_8_ = lVar19;
    auVar27._12_4_ = 0x45300000;
    dVar28 = (auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
  }
  dVar28 = dVar28 / ((double)(uVar18 & 0xffffffff) * 0.5);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb3;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  local_1b8 = dVar28;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(dVar28 == 1.0);
  local_150 = &local_200;
  local_200 = 0x3ff0000000000000;
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_118 = "";
  local_128 = &local_1b8;
  local_40 = (lazy_ostream *)&local_128;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138a870;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_148.m_message.px = (element_type *)(local_148.m_message._1_8_ << 8);
  local_148._0_8_ = &PTR__lazy_ostream_0138a870;
  local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar37 = "hit_rate_fresh";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_1f8,1,2,REQUIRE,0xe5cc21,(size_t)&local_120,0xb3,
             &local_58,"1.0",&local_148);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_210;
  msg_01.m_end = pvVar16;
  msg_01.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
             msg_01);
  dVar28 = (double)(uVar18 & 0xffffffff) * 0.25;
  local_278 = local_278 / dVar28;
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_278 + local_278 < local_248 / dVar28);
  local_148.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
  local_1f8._0_8_ = "hit_rate_stale > 2 * hit_rate_erased_but_contained";
  local_1f8._8_8_ = "";
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_228 = "";
  local_40 = (lazy_ostream *)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0,WARN,(check_type)pcVar37,(size_t)&local_230,0xb6);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  if (local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0._M_p != (_Bit_type *)0x0) {
    operator_delete(local_d0._M_p,local_b0._0_8_ - (long)local_d0._M_p);
    local_d0._0_12_ = ZEXT812(0);
    local_c0._0_12_ = ZEXT812(0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_b0._8_8_;
    local_b0 = auVar7 << 0x40;
  }
  if ((atomic<unsigned_char> *)local_f8._32_8_ != (atomic<unsigned_char> *)0x0) {
    operator_delete__((void *)local_f8._32_8_);
  }
  local_f8._32_8_ =
       (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
        )0x0;
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_erase(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;

    /** Insert the first half */
    for (uint32_t i = 0; i < (n_insert / 2); ++i)
        set.insert(hashes_insert_copy[i]);
    /** Erase the first quarter */
    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        BOOST_CHECK(set.contains(hashes[i], true));
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked as erased but are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}